

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O2

feed_db_status_t import_feed_db(char *dir,feed_db_t *db)

{
  uint uVar1;
  feed_db_status_t fVar2;
  char *table;
  ulong uVar3;
  ulong uVar4;
  char **filenames;
  uint local_3c;
  char *full_file_name;
  
  uVar1 = list_txt_files(dir,&filenames);
  begin_transaction_db(db);
  uVar4 = 0;
  uVar3 = 0;
  local_3c = uVar1;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
      end_transaction_db(db);
      fVar2 = FEED_DB_SUCCESS;
LAB_0012710b:
      free_cstr_arr(filenames,(long)(int)local_3c);
      return fVar2;
    }
    make_filepath(&full_file_name,dir,filenames[uVar4]);
    table = get_filename_no_ext(filenames[uVar4],'/');
    fVar2 = import_csv_file_db(full_file_name,table,db);
    free(table);
    free(full_file_name);
    if (fVar2 == FEED_DB_ERROR) {
      fVar2 = FEED_DB_ERROR;
      goto LAB_0012710b;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

feed_db_status_t import_feed_db(const char *dir, feed_db_t *db) {
    char **filenames;
    int filecount = 0;

    char *full_file_name;
    char *table_file_name;

    filecount = list_txt_files(dir, &filenames);

    begin_transaction_db(db);

    for (int i = 0; i < filecount; i++) {
        make_filepath(&full_file_name, dir, filenames[i]);
        table_file_name = get_filename_no_ext(filenames[i], *FILENAME_SEPARATOR);

        if (FEED_DB_SUCCESS != import_csv_file_db(full_file_name, table_file_name, db)) {
            free(table_file_name);
            free(full_file_name);
            free_cstr_arr(filenames, filecount);
            return FEED_DB_ERROR;
        }
        free(table_file_name);
        free(full_file_name);
    }

    end_transaction_db(db);

    free_cstr_arr(filenames, filecount);
    return FEED_DB_SUCCESS;
}